

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS
ref_iso_segment(REF_GRID_conflict ref_grid,REF_DBL *center,REF_DBL aoa,REF_DBL phi,REF_DBL h,
               REF_DBL *segment0,REF_DBL *segment1)

{
  double dVar1;
  double dVar2;
  REF_MPI ref_mpi;
  REF_NODE pRVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  REF_DBL x;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  ref_mpi = ref_grid->mpi;
  pRVar3 = ref_grid->node;
  local_48 = 1e+200;
  local_50 = -1e+200;
  if (0 < (long)pRVar3->max) {
    plVar6 = pRVar3->global;
    dVar16 = -1e+200;
    dVar10 = 1e+200;
    bVar4 = true;
    lVar8 = 0;
    do {
      if (-1 < *plVar6) {
        local_50 = *(double *)((long)pRVar3->real + lVar8);
        if (bVar4) {
          bVar4 = false;
          dVar10 = local_50;
          dVar16 = local_50;
          local_48 = local_50;
        }
        else {
          if (local_50 <= dVar10) {
            dVar10 = local_50;
          }
          if (dVar16 <= local_50) {
            dVar16 = local_50;
          }
          bVar4 = false;
          local_50 = dVar16;
          local_48 = dVar10;
        }
      }
      lVar8 = lVar8 + 0x78;
      plVar6 = plVar6 + 1;
    } while ((long)pRVar3->max * 0x78 - lVar8 != 0);
  }
  uVar5 = ref_mpi_min(ref_mpi,&local_48,&local_40,3);
  if (uVar5 == 0) {
    uVar5 = ref_mpi_bcast(ref_mpi,&local_40,1,3);
    if (uVar5 == 0) {
      local_48 = local_40;
      uVar5 = ref_mpi_max(ref_mpi,&local_50,&local_40,3);
      if (uVar5 == 0) {
        uVar5 = ref_mpi_bcast(ref_mpi,&local_40,1,3);
        if (uVar5 == 0) {
          local_50 = (local_40 - local_48) * 0.1 + local_40;
          *segment0 = (local_40 - local_48) * -0.1 + local_48;
          dVar10 = center[1];
          dVar16 = (phi / 180.0) * 3.14159265358979;
          dVar11 = sin(dVar16);
          segment0[1] = dVar11 * h + dVar10;
          dVar10 = center[2];
          dVar11 = cos(dVar16);
          segment0[2] = dVar10 - dVar11 * h;
          *segment1 = local_50;
          dVar10 = center[1];
          dVar11 = sin(dVar16);
          segment1[1] = dVar11 * h + dVar10;
          dVar10 = center[2];
          dVar16 = cos(dVar16);
          segment1[2] = dVar10 - dVar16 * h;
          dVar10 = *segment0;
          dVar16 = *center;
          *segment0 = dVar10 - dVar16;
          segment0[1] = segment0[1] - center[1];
          segment0[2] = segment0[2] - center[2];
          dVar12 = (aoa / -180.0) * 3.14159265358979;
          dVar13 = cos(dVar12);
          dVar11 = segment0[2];
          dVar14 = sin(dVar12);
          dVar1 = *segment0;
          dVar2 = segment0[1];
          local_30 = sin(dVar12);
          local_38 = segment0[2];
          dVar15 = cos(dVar12);
          *segment0 = dVar13 * (dVar10 - dVar16) + dVar14 * dVar11 + *center;
          segment0[1] = dVar2 + center[1];
          segment0[2] = (dVar15 * local_38 - local_30 * dVar1) + center[2];
          dVar10 = *segment1;
          dVar16 = *center;
          *segment1 = dVar10 - dVar16;
          segment1[1] = segment1[1] - center[1];
          segment1[2] = segment1[2] - center[2];
          dVar13 = cos(dVar12);
          dVar11 = segment1[2];
          dVar14 = sin(dVar12);
          dVar1 = *segment1;
          dVar2 = segment1[1];
          local_30 = sin(dVar12);
          local_38 = segment1[2];
          dVar12 = cos(dVar12);
          *segment1 = dVar13 * (dVar10 - dVar16) + dVar14 * dVar11 + *center;
          segment1[1] = dVar2 + center[1];
          segment1[2] = (dVar12 * local_38 - local_30 * dVar1) + center[2];
          return 0;
        }
        pcVar9 = "bcast max";
        uVar7 = 0x2ec;
      }
      else {
        pcVar9 = "mpi max";
        uVar7 = 0x2eb;
      }
    }
    else {
      pcVar9 = "bcast min";
      uVar7 = 0x2e9;
    }
  }
  else {
    pcVar9 = "mpi min";
    uVar7 = 0x2e8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar7,
         "ref_iso_segment",(ulong)uVar5,pcVar9);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment(REF_GRID ref_grid, REF_DBL *center,
                                   REF_DBL aoa, REF_DBL phi, REF_DBL h,
                                   REF_DBL *segment0, REF_DBL *segment1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL x, x0, x1, dx;
  REF_DBL new_p[3];
  REF_INT node;
  REF_BOOL first;
  x0 = REF_DBL_MAX;
  x1 = REF_DBL_MIN;
  first = REF_TRUE;
  each_ref_node_valid_node(ref_node, node) {
    if (first) {
      first = REF_FALSE;
      x0 = ref_node_xyz(ref_node, 0, node);
      x1 = ref_node_xyz(ref_node, 0, node);
    } else {
      x0 = MIN(x0, ref_node_xyz(ref_node, 0, node));
      x1 = MAX(x1, ref_node_xyz(ref_node, 0, node));
    }
  }
  RSS(ref_mpi_min(ref_mpi, &x0, &x, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast min");
  x0 = x;
  RSS(ref_mpi_max(ref_mpi, &x1, &x, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast max");
  x1 = x;

  dx = x1 - x0;
  x0 -= 0.1 * dx;
  x1 += 0.1 * dx;

  segment0[0] = x0;
  segment0[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment0[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment1[0] = x1;
  segment1[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment1[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment0[0] -= center[0];
  segment0[1] -= center[1];
  segment0[2] -= center[2];
  new_p[0] = segment0[0] * cos(ref_math_in_radians(-aoa)) +
             segment0[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment0[1];
  new_p[2] = -segment0[0] * sin(ref_math_in_radians(-aoa)) +
             segment0[2] * cos(ref_math_in_radians(-aoa));
  segment0[0] = center[0] + new_p[0];
  segment0[1] = center[1] + new_p[1];
  segment0[2] = center[2] + new_p[2];

  segment1[0] -= center[0];
  segment1[1] -= center[1];
  segment1[2] -= center[2];
  new_p[0] = segment1[0] * cos(ref_math_in_radians(-aoa)) +
             segment1[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment1[1];
  new_p[2] = -segment1[0] * sin(ref_math_in_radians(-aoa)) +
             segment1[2] * cos(ref_math_in_radians(-aoa));
  segment1[0] = center[0] + new_p[0];
  segment1[1] = center[1] + new_p[1];
  segment1[2] = center[2] + new_p[2];

  return REF_SUCCESS;
}